

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void jumpscopeerror(LexState *ls,Labeldesc *gt)

{
  char *msg;
  
  msg = luaO_pushfstring(ls->L,"<goto %s> at line %d jumps into the scope of local \'%s\'",
                         gt->name->contents,(ulong)(uint)gt->line,
                         *(long *)((long)(ls->fs->ls->dyd->actvar).arr +
                                  ((long)ls->fs->firstlocal + (ulong)gt->nactvar) * 0x18 + 0x10) +
                         0x18);
  luaK_semerror(ls,msg);
}

Assistant:

static l_noret jumpscopeerror (LexState *ls, Labeldesc *gt) {
  const char *varname = getstr(getlocalvardesc(ls->fs, gt->nactvar)->vd.name);
  const char *msg = "<goto %s> at line %d jumps into the scope of local '%s'";
  msg = luaO_pushfstring(ls->L, msg, getstr(gt->name), gt->line, varname);
  luaK_semerror(ls, msg);  /* raise the error */
}